

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O3

void writeRgba3(char *fileName,Rgba *pixels,int width,int height,char *comments,
               M44f *cameraTransform)

{
  int iVar1;
  RgbaOutputFile file;
  Header header;
  allocator<char> local_d1;
  Rgba local_d0 [9];
  long *local_88 [2];
  long local_78 [2];
  Header local_68 [56];
  
  local_d0[0].r._h = 0;
  local_d0[0].g._h = 0;
  local_d0[0].b._h = 0;
  local_d0[0].a._h = 0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,local_68,width,height,local_d0,0,3);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,comments,&local_d1);
  Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute((string *)local_d0);
  Imf_3_4::Header::insert((char *)local_68,(Attribute *)"comments");
  Imf_3_4::TypedAttribute<std::__cxx11::string>::~TypedAttribute
            ((TypedAttribute<std::__cxx11::string> *)local_d0);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::TypedAttribute((Matrix44 *)local_d0);
  Imf_3_4::Header::insert((char *)local_68,(Attribute *)"cameraTransform");
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<float>> *)local_d0);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_d0,fileName,local_68,WRITE_RGBA,iVar1);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_d0,(ulong)pixels,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)local_d0);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_d0);
  Imf_3_4::Header::~Header(local_68);
  return;
}

Assistant:

void
writeRgba3 (
    const char  fileName[],
    const Rgba* pixels,
    int         width,
    int         height,
    const char  comments[],
    const M44f& cameraTransform)
{
    //
    // Write an RGBA image using class RgbaOutputFile.
    // Store two extra attributes in the image header:
    // a string and a 4x4 transformation matrix.
    //
    //	- open the file
    //	- describe the memory layout of the pixels
    //	- store the pixels in the file
    //

    Header header (width, height);
    header.insert ("comments", StringAttribute (comments));
    header.insert ("cameraTransform", M44fAttribute (cameraTransform));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (height);
}